

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

bool CheckSignatureEncoding
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,uint flags,
               ScriptError *serror)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  ScriptError SVar4;
  long lVar5;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSigCopy;
  allocator_type local_51;
  void *local_50 [2];
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __first._M_current =
       (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  bVar2 = true;
  lVar5 = (long)(vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)__first._M_current;
  if (lVar5 == 0) goto LAB_00823c01;
  if (((flags & 0xe) == 0) ||
     (bVar2 = IsValidSignatureEncoding
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__first._M_current
                        ), bVar2)) {
    bVar2 = true;
    if ((flags & 8) == 0) {
LAB_00823b43:
      if (((flags & 2) == 0) ||
         ((puVar1 = (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish,
          puVar1 != (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start &&
          ((byte)((puVar1[-1] & 0x7f) - 1) < 3)))) goto LAB_00823c01;
      SVar4 = SCRIPT_ERR_SIG_HASHTYPE;
      goto LAB_00823bf8;
    }
    bVar3 = IsValidSignatureEncoding
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__first._M_current);
    if (!bVar3) {
      SVar4 = SCRIPT_ERR_SIG_DER;
      goto LAB_00823bf8;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_50,__first,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(__first._M_current + lVar5 + -1),&local_51);
    bVar3 = CPubKey::CheckLowS((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    if (serror != (ScriptError *)0x0 && !bVar3) {
      *serror = SCRIPT_ERR_SIG_HIGH_S;
    }
    if (local_50[0] != (void *)0x0) {
      operator_delete(local_50[0],local_40 - (long)local_50[0]);
    }
    if (bVar3) goto LAB_00823b43;
  }
  else {
    SVar4 = SCRIPT_ERR_SIG_DER;
LAB_00823bf8:
    if (serror != (ScriptError *)0x0) {
      *serror = SVar4;
    }
  }
  bVar2 = false;
LAB_00823c01:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CheckSignatureEncoding(const std::vector<unsigned char> &vchSig, unsigned int flags, ScriptError* serror) {
    // Empty signature. Not strictly DER encoded, but allowed to provide a
    // compact way to provide an invalid signature for use with CHECK(MULTI)SIG
    if (vchSig.size() == 0) {
        return true;
    }
    if ((flags & (SCRIPT_VERIFY_DERSIG | SCRIPT_VERIFY_LOW_S | SCRIPT_VERIFY_STRICTENC)) != 0 && !IsValidSignatureEncoding(vchSig)) {
        return set_error(serror, SCRIPT_ERR_SIG_DER);
    } else if ((flags & SCRIPT_VERIFY_LOW_S) != 0 && !IsLowDERSignature(vchSig, serror)) {
        // serror is set
        return false;
    } else if ((flags & SCRIPT_VERIFY_STRICTENC) != 0 && !IsDefinedHashtypeSignature(vchSig)) {
        return set_error(serror, SCRIPT_ERR_SIG_HASHTYPE);
    }
    return true;
}